

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_all.c
# Opt level: O0

int archive_read_support_format_all(archive *a)

{
  int iVar1;
  archive *in_RDI;
  int magic_test;
  archive *in_stack_00000028;
  archive *in_stack_00000030;
  char *in_stack_00000088;
  uint in_stack_00000090;
  uint in_stack_00000094;
  archive *in_stack_00000098;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000098,in_stack_00000094,in_stack_00000090,in_stack_00000088);
  if (iVar1 == -0x1e) {
    iVar1 = -0x1e;
  }
  else {
    archive_read_support_format_ar(in_stack_00000028);
    archive_read_support_format_cpio(in_stack_00000028);
    archive_read_support_format_empty(in_stack_00000028);
    archive_read_support_format_lha(in_stack_00000028);
    archive_read_support_format_mtree(in_stack_00000028);
    archive_read_support_format_tar(in_stack_00000028);
    archive_read_support_format_xar
              ((archive *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    archive_read_support_format_7zip(in_stack_00000028);
    archive_read_support_format_cab(in_stack_00000028);
    archive_read_support_format_rar(in_stack_00000030);
    archive_read_support_format_iso9660(in_stack_00000028);
    archive_read_support_format_zip((archive *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    archive_clear_error(in_RDI);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
archive_read_support_format_all(struct archive *a)
{
	archive_check_magic(a, ARCHIVE_READ_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_read_support_format_all");

	/* TODO: It would be nice to compute the ordering
	 * here automatically so that people who enable just
	 * a few formats can still get the benefits.  That
	 * may just require the format registration to include
	 * a "maximum read-ahead" value (anything that uses seek
	 * would be essentially infinite read-ahead).  The core
	 * bid management can then sort the bidders before calling
	 * them.
	 *
	 * If you implement the above, please return the list below
	 * to alphabetic order.
	 */

	/*
	 * These bidders are all pretty cheap; they just examine a
	 * small initial part of the archive.  If one of these bids
	 * high, we can maybe avoid running any of the more expensive
	 * bidders below.
	 */
	archive_read_support_format_ar(a);
	archive_read_support_format_cpio(a);
	archive_read_support_format_empty(a);
	archive_read_support_format_lha(a);
	archive_read_support_format_mtree(a);
	archive_read_support_format_tar(a);
	archive_read_support_format_xar(a);

	/*
	 * Install expensive bidders last.  By doing them last, we
	 * increase the chance that a high bid from someone else will
	 * make it unnecessary for these to do anything at all.
	 */
	/* These three have potentially large look-ahead. */
	archive_read_support_format_7zip(a);
	archive_read_support_format_cab(a);
	archive_read_support_format_rar(a);
	archive_read_support_format_iso9660(a);
	/* Seek is really bad, since it forces the read-ahead
	 * logic to discard buffered data. */
	archive_read_support_format_zip(a);

	/* Note: We always return ARCHIVE_OK here, even if some of the
	 * above return ARCHIVE_WARN.  The intent here is to enable
	 * "as much as possible."  Clients who need specific
	 * compression should enable those individually so they can
	 * verify the level of support. */
	/* Clear any warning messages set by the above functions. */
	archive_clear_error(a);
	return (ARCHIVE_OK);
}